

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  
  xmlSkipBlankChars(ctxt);
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  if (*pxVar3 != 'e') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[1] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[2] != 'c') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[3] != 'o') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[4] != 'd') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[5] != 'i') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[6] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar3[7] != 'g') {
    return (xmlChar *)0x0;
  }
  pxVar2->cur = pxVar3 + 8;
  pxVar2->col = pxVar2->col + 8;
  if (pxVar3[8] == '\0') {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur != '=') {
    xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  xmlNextChar(ctxt);
  xmlSkipBlankChars(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '\'') {
    xmlNextChar(ctxt);
    pxVar3 = xmlParseEncName(ctxt);
    if (*ctxt->input->cur != '\'') {
LAB_00139f91:
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      (*xmlFree)(pxVar3);
      return (xmlChar *)0x0;
    }
  }
  else {
    if (xVar1 != '\"') {
      pxVar3 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
      goto LAB_00139fc3;
    }
    xmlNextChar(ctxt);
    pxVar3 = xmlParseEncName(ctxt);
    if (*ctxt->input->cur != '\"') goto LAB_00139f91;
  }
  xmlNextChar(ctxt);
LAB_00139fc3:
  if (pxVar3 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  xmlSetDeclaredEncoding(ctxt,pxVar3);
  return ctxt->encoding;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g') == 0)
        return(NULL);

    SKIP(8);
    SKIP_BLANKS;
    if (RAW != '=') {
        xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
        return(NULL);
    }
    NEXT;
    SKIP_BLANKS;
    if (RAW == '"') {
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '"') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else if (RAW == '\''){
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '\'') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else {
        xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
    }

    if (encoding == NULL)
        return(NULL);

    xmlSetDeclaredEncoding(ctxt, encoding);

    return(ctxt->encoding);
}